

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cjson_add.c
# Opt level: O2

void cjson_add_true_should_add_true(void)

{
  cJSON *object;
  cJSON *pcVar1;
  
  object = cJSON_CreateObject();
  cJSON_AddTrueToObject(object,"true");
  pcVar1 = cJSON_GetObjectItemCaseSensitive(object,"true");
  if (pcVar1 == (cJSON *)0x0) {
    UnityFail(" Expected Non-NULL",0x5b);
  }
  UnityAssertEqualNumber((long)pcVar1->type,2,(char *)0x0,0x5c,UNITY_DISPLAY_STYLE_INT);
  cJSON_Delete(object);
  return;
}

Assistant:

static void cjson_add_true_should_add_true(void)
{
    cJSON *root = cJSON_CreateObject();
    cJSON *true_item = NULL;

    cJSON_AddTrueToObject(root, "true");

    TEST_ASSERT_NOT_NULL(true_item = cJSON_GetObjectItemCaseSensitive(root, "true"));
    TEST_ASSERT_EQUAL_INT(true_item->type, cJSON_True);

    cJSON_Delete(root);
}